

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cpp
# Opt level: O1

void __thiscall QPdf::ByteStream::ByteStream(ByteStream *this,bool fileBacking)

{
  QBuffer *this_00;
  
  this_00 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_00,&this->ba,(QObject *)0x0);
  this->dev = (QIODevice *)this_00;
  (this->ba).d.d = (Data *)0x0;
  (this->ba).d.ptr = (char *)0x0;
  (this->ba).d.size = 0;
  this->fileBackingEnabled = fileBacking;
  this->fileBackingActive = false;
  this->handleDirty = false;
  (**(code **)(*(long *)this_00 + 0x68))(this_00,3);
  return;
}

Assistant:

ByteStream::ByteStream(bool fileBacking)
            : dev(new QBuffer(&ba)),
            fileBackingEnabled(fileBacking),
            fileBackingActive(false),
            handleDirty(false)
    {
        dev->open(QIODevice::ReadWrite);
    }